

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_QPDFTokenizer.cc
# Opt level: O0

void __thiscall
Pl_QPDFTokenizer::Pl_QPDFTokenizer
          (Pl_QPDFTokenizer *this,char *identifier,TokenFilter *filter,Pipeline *next)

{
  pointer pMVar1;
  Pipeline *next_local;
  TokenFilter *filter_local;
  char *identifier_local;
  Pl_QPDFTokenizer *this_local;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_QPDFTokenizer_00596538;
  std::make_unique<Pl_QPDFTokenizer::Members>();
  pMVar1 = std::
           unique_ptr<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>::
           operator->(&this->m);
  pMVar1->filter = filter;
  pMVar1 = std::
           unique_ptr<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>::
           operator->(&this->m);
  QPDFObjectHandle::TokenFilter::PipelineAccessor::setPipeline(pMVar1->filter,next);
  pMVar1 = std::
           unique_ptr<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>::
           operator->(&this->m);
  QPDFTokenizer::allowEOF(&pMVar1->tokenizer);
  pMVar1 = std::
           unique_ptr<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>::
           operator->(&this->m);
  QPDFTokenizer::includeIgnorable(&pMVar1->tokenizer);
  return;
}

Assistant:

Pl_QPDFTokenizer::Pl_QPDFTokenizer(
    char const* identifier, QPDFObjectHandle::TokenFilter* filter, Pipeline* next) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>())
{
    m->filter = filter;
    QPDFObjectHandle::TokenFilter::PipelineAccessor::setPipeline(m->filter, next);
    m->tokenizer.allowEOF();
    m->tokenizer.includeIgnorable();
}